

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADAFWPointerArray.h
# Opt level: O0

void __thiscall
COLLADAFW::PointerArray<COLLADAFW::InstanceKinematicsScene>::~PointerArray
          (PointerArray<COLLADAFW::InstanceKinematicsScene> *this)

{
  PointerArray<COLLADAFW::InstanceKinematicsScene> *in_RDI;
  
  ~PointerArray(in_RDI);
  operator_delete(in_RDI,0x28);
  return;
}

Assistant:

virtual ~PointerArray()
		{
			deleteContents();
		}